

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_logical_operator.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::LogicalExport::Deserialize(LogicalExport *this,Deserializer *deserializer)

{
  LogicalExport *this_00;
  ClientContext *context;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::ParseInfo_*,_false> local_38;
  _Head_base<0UL,_duckdb::ParseInfo_*,_false> local_30;
  undefined1 local_28 [8];
  ParseInfo *local_20;
  
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParseInfo,std::default_delete<duckdb::ParseInfo>,true>>
            ((Deserializer *)&stack0xffffffffffffffe0,(field_id_t)deserializer,(char *)0xc8);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParseInfo,std::default_delete<duckdb::ParseInfo>,true>>
            ((Deserializer *)local_28,(field_id_t)deserializer,(char *)0xc9);
  this_00 = (LogicalExport *)operator_new(0x328);
  context = SerializationData::Get<duckdb::ClientContext&>(&deserializer->data);
  local_30._M_head_impl = local_20;
  local_20 = (ParseInfo *)0x0;
  local_38._M_head_impl = (ParseInfo *)local_28;
  local_28 = (undefined1  [8])0x0;
  LogicalExport(this_00,context,
                (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> *)
                &local_30,
                (unique_ptr<duckdb::ParseInfo,_std::default_delete<duckdb::ParseInfo>,_true> *)
                &local_38);
  if (local_38._M_head_impl != (ParseInfo *)0x0) {
    (*(local_38._M_head_impl)->_vptr_ParseInfo[1])();
  }
  local_38._M_head_impl = (ParseInfo *)0x0;
  if (local_30._M_head_impl != (ParseInfo *)0x0) {
    (*(local_30._M_head_impl)->_vptr_ParseInfo[1])();
  }
  local_30._M_head_impl = (ParseInfo *)0x0;
  (this->super_LogicalOperator)._vptr_LogicalOperator = (_func_int **)this_00;
  if (local_28 != (undefined1  [8])0x0) {
    (**(code **)(*(_func_int **)local_28 + 8))();
  }
  if (local_20 != (ParseInfo *)0x0) {
    (**(code **)(*(_func_int **)local_20 + 8))();
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> LogicalExport::Deserialize(Deserializer &deserializer) {
	auto copy_info = deserializer.ReadPropertyWithDefault<unique_ptr<ParseInfo>>(200, "copy_info");
	auto exported_tables = deserializer.ReadPropertyWithDefault<unique_ptr<ParseInfo>>(201, "exported_tables");
	auto result = duckdb::unique_ptr<LogicalExport>(new LogicalExport(deserializer.Get<ClientContext &>(), std::move(copy_info), std::move(exported_tables)));
	return std::move(result);
}